

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O3

char * cast_node_set_to_string(lyxp_set *set,lyd_node *cur_node,lys_module *param_3,int options)

{
  uint uVar1;
  lyd_node *node;
  undefined8 in_RAX;
  char *pcVar2;
  LY_ERR *pLVar3;
  int fake_cont;
  lyxp_node_type local_24 [2];
  lyxp_node_type root_type;
  
  local_24[0] = (lyxp_node_type)((ulong)in_RAX >> 0x20);
  uVar1 = *(uint *)&set->field_0x8;
  if (uVar1 == 4) {
    moveto_get_root(cur_node,options,local_24);
    pcVar2 = strdup(*(char **)(*(long *)set + 0x20));
    return pcVar2;
  }
  node = *(lyd_node **)set;
  if ((char)node->validity < '\0') {
    ly_vlog(LYE_XPATH_DUMMY,LY_VLOG_LYD,node,node->schema->name);
    return (char *)0x0;
  }
  moveto_get_root(cur_node,options,local_24);
  if (uVar1 - 2 < 2) {
    fake_cont = 0;
  }
  else {
    if (1 < uVar1) {
      pLVar3 = ly_errno_location();
      *pLVar3 = LY_EINT;
      ly_log(LY_LLERR,"Internal error (%s:%d).",
             "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/xpath.c",
             0x221);
      return (char *)0x0;
    }
    fake_cont = 1;
  }
  pcVar2 = cast_string_elem(node,param_3,fake_cont,local_24[0]);
  return pcVar2;
}

Assistant:

static char *
cast_node_set_to_string(struct lyxp_set *set, struct lyd_node *cur_node, struct lys_module *local_mod, int options)
{
    enum lyxp_node_type root_type;

    if ((set->val.nodes[0].type != LYXP_NODE_ATTR) && (set->val.nodes[0].node->validity & LYD_VAL_INUSE)) {
        LOGVAL(LYE_XPATH_DUMMY, LY_VLOG_LYD, set->val.nodes[0].node, set->val.nodes[0].node->schema->name);
        return NULL;
    }

    moveto_get_root(cur_node, options, &root_type);

    switch (set->val.nodes[0].type) {
    case LYXP_NODE_ROOT:
    case LYXP_NODE_ROOT_CONFIG:
        return cast_string_elem(set->val.nodes[0].node, local_mod, 1, root_type);
    case LYXP_NODE_ELEM:
    case LYXP_NODE_TEXT:
        return cast_string_elem(set->val.nodes[0].node, local_mod, 0, root_type);
    case LYXP_NODE_ATTR:
        return strdup(set->val.attrs[0].attr->value_str);
    }

    LOGINT;
    return NULL;
}